

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall
ON_RTree::Search(ON_RTree *this,double tolerance,
                _func_bool_void_ptr_ON__INT_PTR_ON__INT_PTR_double_ptr *resultCallback,
                void *a_context)

{
  ON_RTreeNode *pOVar1;
  bool bVar2;
  ON_RTreePairSearchCallbackResultBoolTolerance r;
  ON_RTreePairSearchCallbackResultBoolTolerance local_38;
  
  pOVar1 = this->m_root;
  if (pOVar1 != (ON_RTreeNode *)0x0) {
    bVar2 = ON_IsValid(tolerance);
    local_38.m_tolerance = tolerance;
    if (!bVar2) {
      local_38.m_tolerance = 0.0;
    }
    local_38.m_tolerance = (double)(-(ulong)(0.0 < tolerance) & (ulong)local_38.m_tolerance);
    local_38.m_context = a_context;
    local_38.m_resultCallbackBoolTolerance = resultCallback;
    SingleTreeSearchHelperBoolTolerance(this->m_root,this->m_root,&local_38);
  }
  return pOVar1 != (ON_RTreeNode *)0x0;
}

Assistant:

bool ON_RTree::Search(
  double tolerance,
  bool ON_CALLBACK_CDECL resultCallback(void* a_context, ON__INT_PTR a_idA, ON__INT_PTR a_idB, double* tolerance),
  void* a_context
  ) const
{
  if (0 == this->m_root)
    return false;
  ON_RTreePairSearchCallbackResultBoolTolerance r;
  r.m_tolerance = (ON_IsValid(tolerance) && tolerance > 0.0) ? tolerance : 0.0;
  r.m_context = a_context;
  r.m_resultCallbackBoolTolerance = resultCallback;

  // Do not return false if PairSearchHelperBool() returns false.  The only reason
  // PairSearchHelperBool() returns false is that the user specified resultCallback()
  // terminated the search. This way a programmer with the ability to reason can
  // distinguish between a termination and a failure to start because input is
  // missing.
  SingleTreeSearchHelperBoolTolerance(this->m_root, this->m_root, &r);

  return true;
}